

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

char * get_header(mg_header *hdr,int num_hdr,char *name)

{
  int iVar1;
  int local_2c;
  int i;
  char *name_local;
  int num_hdr_local;
  mg_header *hdr_local;
  
  local_2c = 0;
  while( true ) {
    if (num_hdr <= local_2c) {
      return (char *)0x0;
    }
    iVar1 = mg_strcasecmp(name,hdr[local_2c].name);
    if (iVar1 == 0) break;
    local_2c = local_2c + 1;
  }
  return hdr[local_2c].value;
}

Assistant:

static const char *
get_header(const struct mg_header *hdr, int num_hdr, const char *name)
{
	int i;
	for (i = 0; i < num_hdr; i++) {
		if (!mg_strcasecmp(name, hdr[i].name)) {
			return hdr[i].value;
		}
	}

	return NULL;
}